

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O2

int g2d_polygon_contains_point_ref(zarray_t *poly,double *q)

{
  int iVar1;
  int i;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double p [2];
  double local_50;
  double local_48;
  double local_38;
  double local_30;
  
  iVar1 = zarray_size(poly);
  local_50 = 0.0;
  for (iVar2 = 0; iVar2 <= iVar1; iVar2 = iVar2 + 1) {
    zarray_get(poly,iVar2 % iVar1,&local_38);
    dVar3 = atan2(q[1] - local_30,*q - local_38);
    if (iVar2 != 0) {
      dVar5 = (dVar3 - local_48) + 3.141592653589793;
      dVar4 = floor(dVar5 / 6.283185307179586);
      local_50 = local_50 + dVar4 * -6.283185307179586 + dVar5 + -3.141592653589793;
    }
    local_48 = dVar3;
  }
  return (int)(3.141592653589793 < local_50);
}

Assistant:

int g2d_polygon_contains_point_ref(const zarray_t *poly, double q[2])
{
    // use winding. If the point is inside the polygon, we'll wrap
    // around it (accumulating 6.28 radians). If we're outside the
    // polygon, we'll accumulate zero.
    int psz = zarray_size(poly);

    double acc_theta = 0;

    double last_theta;

    for (int i = 0; i <= psz; i++) {
        double p[2];

        zarray_get(poly, i % psz, &p);

        double this_theta = atan2(q[1]-p[1], q[0]-p[0]);

        if (i != 0)
            acc_theta += mod2pi(this_theta - last_theta);

        last_theta = this_theta;
    }

    return acc_theta > M_PI;
}